

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_unpack(lua_State *L)

{
  KOption KVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer n;
  ulong totalsize;
  int ntoalign;
  int size;
  size_t ld;
  char *fmt;
  Header h;
  Ftypes u;
  
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  fmt = pcVar3;
  luaL_checklstring(L,2,&ld);
  n = luaL_optinteger(L,3,1);
  if (n < 0) {
    if (ld < (ulong)-n) {
      n = 0;
    }
    else {
      n = n + ld + 1;
    }
  }
  totalsize = n - 1;
  if (ld < totalsize) {
    luaL_argerror(L,3,"initial position out of string");
  }
  h.islittle = 1;
  h.maxalign = 1;
  h.L = L;
  if (*pcVar3 != '\0') {
    KVar1 = getdetails(&h,totalsize,&fmt,&size,&ntoalign);
    if ((CARRY8((long)size + (long)ntoalign,totalsize)) ||
       (ld < (long)ntoalign + totalsize + (long)size)) {
      luaL_argerror(L,2,"data string too short");
    }
    luaL_checkstack(L,2,"too many results");
    iVar2 = (*(code *)(&DAT_001537b8 + *(int *)(&DAT_001537b8 + (ulong)KVar1 * 4)))();
    return iVar2;
  }
  lua_pushinteger(L,n);
  return 1;
}

Assistant:

static int str_unpack (lua_State *L) {
  Header h;
  const char *fmt = luaL_checkstring(L, 1);
  size_t ld;
  const char *data = luaL_checklstring(L, 2, &ld);
  size_t pos = (size_t)posrelat(luaL_optinteger(L, 3, 1), ld) - 1;
  int n = 0;  /* number of results */
  luaL_argcheck(L, pos <= ld, 3, "initial position out of string");
  initheader(L, &h);
  while (*fmt != '\0') {
    int size, ntoalign;
    KOption opt = getdetails(&h, pos, &fmt, &size, &ntoalign);
    if ((size_t)ntoalign + size > ~pos || pos + ntoalign + size > ld)
      luaL_argerror(L, 2, "data string too short");
    pos += ntoalign;  /* skip alignment */
    /* stack space for item + next position */
    luaL_checkstack(L, 2, "too many results");
    n++;
    switch (opt) {
      case Kint:
      case Kuint: {
        lua_Integer res = unpackint(L, data + pos, h.islittle, size,
                                       (opt == Kint));
        lua_pushinteger(L, res);
        break;
      }
      case Kfloat: {
        volatile Ftypes u;
        lua_Number num;
        copywithendian(u.buff, data + pos, size, h.islittle);
        if (size == sizeof(u.f)) num = (lua_Number)u.f;
        else if (size == sizeof(u.d)) num = (lua_Number)u.d;
        else num = u.n;
        lua_pushnumber(L, num);
        break;
      }
      case Kchar: {
        lua_pushlstring(L, data + pos, size);
        break;
      }
      case Kstring: {
        size_t len = (size_t)unpackint(L, data + pos, h.islittle, size, 0);
        luaL_argcheck(L, pos + len + size <= ld, 2, "data string too short");
        lua_pushlstring(L, data + pos + size, len);
        pos += len;  /* skip string */
        break;
      }
      case Kzstr: {
        size_t len = (int)strlen(data + pos);
        lua_pushlstring(L, data + pos, len);
        pos += len + 1;  /* skip string plus final '\0' */
        break;
      }
      case Kpaddalign: case Kpadding: case Knop:
        n--;  /* undo increment */
        break;
    }
    pos += size;
  }
  lua_pushinteger(L, pos + 1);  /* next position */
  return n + 1;
}